

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CategoricalMapping.pb.cc
# Opt level: O2

size_t __thiscall CoreML::Specification::CategoricalMapping::ByteSizeLong(CategoricalMapping *this)

{
  long lVar1;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  
  if (this->_oneof_case_[0] == 2) {
    sVar2 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::Int64ToStringMap>
                      ((this->MappingType_).int64tostringmap_);
LAB_0028cdb6:
    sVar2 = sVar2 + 1;
  }
  else {
    if (this->_oneof_case_[0] == 1) {
      sVar2 = google::protobuf::internal::WireFormatLite::
              MessageSize<CoreML::Specification::StringToInt64Map>
                        ((this->MappingType_).stringtoint64map_);
      goto LAB_0028cdb6;
    }
    sVar2 = 0;
  }
  if (this->_oneof_case_[1] == 0x66) {
    uVar4 = (this->ValueOnUnknown_).int64value_ | 1;
    lVar1 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    sVar3 = (size_t)((int)lVar1 * 9 + 0x49U >> 6);
  }
  else {
    if (this->_oneof_case_[1] != 0x65) goto LAB_0028cdf9;
    sVar3 = google::protobuf::internal::WireFormatLite::StringSize
                      ((string *)((this->ValueOnUnknown_).int64value_ & 0xfffffffffffffffe));
  }
  sVar2 = sVar2 + sVar3 + 2;
LAB_0028cdf9:
  uVar4 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar4 & 1) != 0) {
    sVar2 = sVar2 + *(long *)((uVar4 & 0xfffffffffffffffc) + 0x10);
  }
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type)sVar2;
  return sVar2;
}

Assistant:

size_t CategoricalMapping::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.CategoricalMapping)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  switch (MappingType_case()) {
    // .CoreML.Specification.StringToInt64Map stringToInt64Map = 1;
    case kStringToInt64Map: {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *MappingType_.stringtoint64map_);
      break;
    }
    // .CoreML.Specification.Int64ToStringMap int64ToStringMap = 2;
    case kInt64ToStringMap: {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *MappingType_.int64tostringmap_);
      break;
    }
    case MAPPINGTYPE_NOT_SET: {
      break;
    }
  }
  switch (ValueOnUnknown_case()) {
    // string strValue = 101;
    case kStrValue: {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_strvalue());
      break;
    }
    // int64 int64Value = 102;
    case kInt64Value: {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int64Size(
          this->_internal_int64value());
      break;
    }
    case VALUEONUNKNOWN_NOT_SET: {
      break;
    }
  }
  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}